

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

void __thiscall CTcTokenizer::write_macros_to_file_for_debug(CTcTokenizer *this,CVmFile *fp)

{
  long seekpos;
  long seekpos_00;
  write_macro_ctx_t ctx;
  CVmFile *local_30;
  undefined8 local_28;
  
  seekpos = CVmFile::get_pos(fp);
  CVmFile::write_uint4(fp,0);
  local_28 = 0;
  local_30 = fp;
  enum_defines(this,write_macros_cb,&local_30);
  seekpos_00 = CVmFile::get_pos(fp);
  CVmFile::set_pos(fp,seekpos);
  CVmFile::write_uint4(fp,(uint)local_28);
  CVmFile::set_pos(fp,seekpos_00);
  return;
}

Assistant:

void CTcTokenizer::write_macros_to_file_for_debug(CVmFile *fp)
{
    long pos;
    long endpos;
    write_macro_ctx_t ctx;

    /* write a placeholder for the symbol count */
    pos = fp->get_pos();
    fp->write_uint4(0);

    /* write the symbols */
    ctx.fp = fp;
    ctx.cnt = 0;
    enum_defines(&write_macros_cb, &ctx);

    /* go back and fix up the symbol count */
    endpos = fp->get_pos();
    fp->set_pos(pos);
    fp->write_uint4(ctx.cnt);

    /* seek back to where we left off */
    fp->set_pos(endpos);
}